

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O2

void __thiscall udpdiscovery::impl::PeerEnv::~PeerEnv(PeerEnv *this)

{
  (this->super_PeerEnvInterface)._vptr_PeerEnvInterface = (_func_int **)&PTR__PeerEnv_0010bd10;
  if (this->binding_sock_ != -1) {
    close(this->binding_sock_);
  }
  if (this->sock_ != -1) {
    close(this->sock_);
  }
  std::__cxx11::
  _List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::_M_clear
            (&(this->discovered_peers_).
              super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
            );
  std::__cxx11::string::_M_dispose();
  pthread_mutex_destroy((pthread_mutex_t *)&this->lock_);
  return;
}

Assistant:

~PeerEnv() {
    if (binding_sock_ != kInvalidSocket) {
      CloseSocket(binding_sock_);
    }

    if (sock_ != kInvalidSocket) {
      CloseSocket(sock_);
    }
  }